

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O1

Vec_Int_t * Llb_Nonlin4SweepVars2Q(Aig_Man_t *pAig,Vec_Int_t *vOrder,int fAddLis)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0;
  pVVar4->nSize = 0;
  pVVar4->pArray = (int *)0x0;
  iVar1 = pAig->vObjs->nSize;
  lVar9 = (long)iVar1;
  if (0 < lVar9) {
    piVar5 = (int *)malloc(lVar9 * 4);
    pVVar4->pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar4->nCap = iVar1;
    if (0 < iVar1) {
      piVar5 = pVVar4->pArray;
      lVar7 = 0;
      do {
        piVar5[lVar7] = 1;
        lVar7 = lVar7 + 1;
      } while (lVar9 != lVar7);
    }
  }
  pVVar4->nSize = iVar1;
  if (0 < pAig->nRegs) {
    pVVar3 = pAig->vCis;
    iVar6 = 0;
    do {
      uVar8 = pAig->nTruePis + iVar6;
      if (((int)uVar8 < 0) || (pVVar3->nSize <= (int)uVar8)) goto LAB_0083ed0d;
      iVar2 = *(int *)((long)pVVar3->pArray[uVar8] + 0x24);
      if (((long)iVar2 < 0) || (vOrder->nSize <= iVar2)) goto LAB_0083ecee;
      iVar2 = vOrder->pArray[iVar2];
      if (((long)iVar2 < 0) || (iVar1 <= iVar2)) goto LAB_0083ed2c;
      pVVar4->pArray[iVar2] = 0;
      iVar6 = iVar6 + 1;
    } while (iVar6 < pAig->nRegs);
  }
  if ((fAddLis != 0) && (0 < pAig->nRegs)) {
    pVVar3 = pAig->vCos;
    iVar6 = 0;
    do {
      uVar8 = pAig->nTruePos + iVar6;
      if (((int)uVar8 < 0) || (pVVar3->nSize <= (int)uVar8)) {
LAB_0083ed0d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar2 = *(int *)((long)pVVar3->pArray[uVar8] + 0x24);
      if (((long)iVar2 < 0) || (vOrder->nSize <= iVar2)) {
LAB_0083ecee:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = vOrder->pArray[iVar2];
      if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
LAB_0083ed2c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar4->pArray[iVar2] = 0;
      iVar6 = iVar6 + 1;
    } while (iVar6 < pAig->nRegs);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Llb_Nonlin4SweepVars2Q( Aig_Man_t * pAig, Vec_Int_t * vOrder, int fAddLis )
{
    Vec_Int_t * vVars2Q;
    Aig_Obj_t * pObj;
    int i;
    vVars2Q = Vec_IntAlloc( 0 );
    Vec_IntFill( vVars2Q, Aig_ManObjNumMax(pAig), 1 );
    // add flop outputs
    Saig_ManForEachLo( pAig, pObj, i )
        Vec_IntWriteEntry( vVars2Q, Llb_ObjBddVar(vOrder, pObj), 0 );
    // add flop inputs
    if ( fAddLis )
    Saig_ManForEachLi( pAig, pObj, i )
        Vec_IntWriteEntry( vVars2Q, Llb_ObjBddVar(vOrder, pObj), 0 );
    return vVars2Q;
}